

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void anon_unknown.dwarf_18676b::ensureExtensionsInit(Display *display,int screen)

{
  undefined4 in_ESI;
  undefined8 in_RDI;
  Display *unaff_retaddr;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (!ensureExtensionsInit::initialized) {
    ensureExtensionsInit::initialized = true;
    gladLoaderLoadGLX(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    gladLoadGLX((Display *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
                (GLADloadfunc)0x250a20);
  }
  return;
}

Assistant:

void ensureExtensionsInit(::Display* display, int screen)
    {
        static bool initialized = false;
        if (!initialized)
        {
            initialized = true;

            // We don't check the return value since the extension
            // flags are cleared even if loading fails
            gladLoaderLoadGLX(display, screen);

            gladLoadGLX(display, screen, sf::priv::GlxContext::getFunction);
        }
    }